

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astcenc_entry.cpp
# Opt level: O0

astcenc_error
astcenc_decompress_image
          (astcenc_context *ctxo,uint8_t *data,size_t data_len,astcenc_image *image_outp,
          astcenc_swizzle *swizzle,uint thread_index)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int *in_RCX;
  ulong in_RDX;
  long in_RDI;
  uint in_R9D;
  symbolic_compressed_block scb;
  uint8_t *bp;
  uint offset;
  int x;
  int y;
  uint rem;
  int z;
  uint i;
  uint base;
  uint count;
  image_block blk;
  size_t size_needed;
  int plane_blocks;
  int row_blocks;
  uint block_count;
  uint zblocks;
  uint yblocks;
  uint xblocks;
  uint block_z;
  uint block_y;
  uint block_x;
  astcenc_contexti *ctx;
  astcenc_image *image_out;
  astcenc_error status;
  image_block *in_stack_000013c8;
  astcenc_swizzle *in_stack_ffffffffffffee40;
  astcenc_swizzle *in_stack_ffffffffffffee48;
  uint *in_stack_ffffffffffffee58;
  uint in_stack_ffffffffffffee64;
  ParallelManager *in_stack_ffffffffffffee68;
  uint in_stack_ffffffffffffeea4;
  ParallelManager *in_stack_ffffffffffffeea8;
  uint local_10ec;
  int local_10e4;
  undefined1 local_10e0 [152];
  symbolic_compressed_block *in_stack_ffffffffffffefb8;
  uint8_t *in_stack_ffffffffffffefc0;
  block_size_descriptor *in_stack_ffffffffffffefc8;
  symbolic_compressed_block *in_stack_fffffffffffff810;
  int in_stack_fffffffffffff81c;
  int in_stack_fffffffffffff820;
  int in_stack_fffffffffffff824;
  block_size_descriptor *in_stack_fffffffffffff828;
  astcenc_profile in_stack_fffffffffffff834;
  uint in_stack_fffffffffffffbd4;
  uint in_stack_fffffffffffffbd8;
  uint in_stack_fffffffffffffbdc;
  block_size_descriptor *in_stack_fffffffffffffbe0;
  image_block *in_stack_fffffffffffffbe8;
  astcenc_image *in_stack_fffffffffffffbf0;
  astcenc_error local_34;
  
  if (in_R9D < *(uint *)(in_RDI + 0x78)) {
    local_34 = validate_decompression_swizzle(in_stack_ffffffffffffee40);
    if (local_34 == ASTCENC_SUCCESS) {
      uVar1 = ((*in_RCX + *(uint *)(in_RDI + 8)) - 1) / *(uint *)(in_RDI + 8);
      uVar2 = ((in_RCX[1] + *(uint *)(in_RDI + 0xc)) - 1) / *(uint *)(in_RDI + 0xc);
      uVar3 = ((in_RCX[2] + *(uint *)(in_RDI + 0x10)) - 1) / *(uint *)(in_RDI + 0x10);
      if (in_RDX < uVar1 * uVar2 * uVar3 * 0x10) {
        local_34 = ASTCENC_ERR_OUT_OF_MEM;
      }
      else {
        memset(local_10e0,0,0x1020);
        if (*(int *)(in_RDI + 0x78) == 1) {
          astcenc_decompress_reset((astcenc_context *)0x547725);
        }
        ParallelManager::init
                  ((ParallelManager *)(in_RDI + 0x240),
                   (EVP_PKEY_CTX *)(ulong)(uVar3 * uVar2 * uVar1));
        while (uVar1 = ParallelManager::get_task_assignment
                                 (in_stack_ffffffffffffee68,in_stack_ffffffffffffee64,
                                  in_stack_ffffffffffffee58), local_10ec = uVar1, local_10e4 != 0) {
          for (; local_10ec < uVar1 + local_10e4; local_10ec = local_10ec + 1) {
            physical_to_symbolic
                      (in_stack_ffffffffffffefc8,in_stack_ffffffffffffefc0,in_stack_ffffffffffffefb8
                      );
            decompress_symbolic_block
                      (in_stack_fffffffffffff834,in_stack_fffffffffffff828,in_stack_fffffffffffff824
                       ,in_stack_fffffffffffff820,in_stack_fffffffffffff81c,
                       in_stack_fffffffffffff810,in_stack_000013c8);
            store_image_block(in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8,
                              in_stack_fffffffffffffbe0,in_stack_fffffffffffffbdc,
                              in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd4,
                              in_stack_ffffffffffffee48);
          }
          ParallelManager::complete_task_assignment
                    (in_stack_ffffffffffffeea8,in_stack_ffffffffffffeea4);
        }
        local_34 = ASTCENC_SUCCESS;
      }
    }
  }
  else {
    local_34 = ASTCENC_ERR_BAD_PARAM;
  }
  return local_34;
}

Assistant:

astcenc_error astcenc_decompress_image(
	astcenc_context* ctxo,
	const uint8_t* data,
	size_t data_len,
	astcenc_image* image_outp,
	const astcenc_swizzle* swizzle,
	unsigned int thread_index
) {
	astcenc_error status;
	astcenc_image& image_out = *image_outp;
	astcenc_contexti* ctx = &ctxo->context;

	// Today this doesn't matter (working set on stack) but might in future ...
	if (thread_index >= ctx->thread_count)
	{
		return ASTCENC_ERR_BAD_PARAM;
	}

	status = validate_decompression_swizzle(*swizzle);
	if (status != ASTCENC_SUCCESS)
	{
		return status;
	}

	unsigned int block_x = ctx->config.block_x;
	unsigned int block_y = ctx->config.block_y;
	unsigned int block_z = ctx->config.block_z;

	unsigned int xblocks = (image_out.dim_x + block_x - 1) / block_x;
	unsigned int yblocks = (image_out.dim_y + block_y - 1) / block_y;
	unsigned int zblocks = (image_out.dim_z + block_z - 1) / block_z;
	unsigned int block_count = zblocks * yblocks * xblocks;

	int row_blocks = xblocks;
	int plane_blocks = xblocks * yblocks;

	// Check we have enough output space (16 bytes per block)
	size_t size_needed = xblocks * yblocks * zblocks * 16;
	if (data_len < size_needed)
	{
		return ASTCENC_ERR_OUT_OF_MEM;
	}

	image_block blk {};
	blk.texel_count = static_cast<uint8_t>(block_x * block_y * block_z);

	// Decode mode inferred from the output data type
	blk.decode_unorm8 = image_out.data_type == ASTCENC_TYPE_U8;

	// If context thread count is one then implicitly reset
	if (ctx->thread_count == 1)
	{
		astcenc_decompress_reset(ctxo);
	}

	// Only the first thread actually runs the initializer
	ctxo->manage_decompress.init(block_count, nullptr);

	// All threads run this processing loop until there is no work remaining
	while (true)
	{
		unsigned int count;
		unsigned int base = ctxo->manage_decompress.get_task_assignment(128, count);
		if (!count)
		{
			break;
		}

		for (unsigned int i = base; i < base + count; i++)
		{
			// Decode i into x, y, z block indices
			int z = i / plane_blocks;
			unsigned int rem = i - (z * plane_blocks);
			int y = rem / row_blocks;
			int x = rem - (y * row_blocks);

			unsigned int offset = (((z * yblocks + y) * xblocks) + x) * 16;
			const uint8_t* bp = data + offset;

			symbolic_compressed_block scb;

			physical_to_symbolic(*ctx->bsd, bp, scb);

			decompress_symbolic_block(ctx->config.profile, *ctx->bsd,
			                          x * block_x, y * block_y, z * block_z,
			                          scb, blk);

			store_image_block(image_out, blk, *ctx->bsd,
			                  x * block_x, y * block_y, z * block_z, *swizzle);
		}

		ctxo->manage_decompress.complete_task_assignment(count);
	}

	return ASTCENC_SUCCESS;
}